

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O1

SUNErrCode SUNHashMap_New(int max_size,SUNHashMap *map)

{
  SUNErrCode SVar1;
  SUNHashMap __ptr;
  SUNHashMapKeyValue *ppSVar2;
  ulong uVar3;
  
  if (max_size < 1) {
    return -0x270d;
  }
  *map = (SUNHashMap)0x0;
  __ptr = (SUNHashMap)malloc(0x10);
  *map = __ptr;
  __ptr->size = 0;
  __ptr->max_size = max_size;
  __ptr->buckets = (SUNHashMapKeyValue *)0x0;
  ppSVar2 = (SUNHashMapKeyValue *)malloc((ulong)(uint)max_size * 8);
  __ptr->buckets = ppSVar2;
  if (ppSVar2 == (SUNHashMapKeyValue *)0x0) {
    free(__ptr);
    SVar1 = -0x2704;
  }
  else {
    SVar1 = 0;
    uVar3 = 0;
    do {
      (*map)->buckets[uVar3] = (SUNHashMapKeyValue)0x0;
      uVar3 = uVar3 + 1;
    } while ((uint)max_size != uVar3);
  }
  return SVar1;
}

Assistant:

SUNErrCode SUNHashMap_New(int max_size, SUNHashMap* map)
{
  int i;

  if (max_size <= 0) { return SUN_ERR_ARG_OUTOFRANGE; }

  *map = NULL;
  *map = (SUNHashMap)malloc(sizeof(**map));

  if (!map) { return SUN_ERR_MALLOC_FAIL; }

  (*map)->size     = 0;
  (*map)->max_size = max_size;

  (*map)->buckets = NULL;
  (*map)->buckets =
    (SUNHashMapKeyValue*)malloc(max_size * sizeof(*((*map)->buckets)));

  if (!(*map)->buckets)
  {
    free(*map);
    return SUN_ERR_MALLOC_FAIL;
  }

  /* Initialize all buckets to NULL */
  for (i = 0; i < max_size; i++) { (*map)->buckets[i] = NULL; }

  return SUN_SUCCESS;
}